

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O2

void __thiscall QWidgetPrivate::scrollRect(QWidgetPrivate *this,QRect *rect,int dx,int dy)

{
  undefined4 uVar1;
  QWidget *this_00;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  char cVar5;
  int iVar6;
  QWidget *parent;
  QWidgetRepaintManager *this_01;
  QRegion *this_02;
  long in_FS_OFFSET;
  QRect QVar7;
  QRegion dirtyScrollRegion;
  undefined8 local_80;
  QRegion childExpose;
  QRect local_70;
  QPoint local_60;
  QRegion region;
  ulong local_50;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&this->field_0x8;
  parent = QWidget::window(this_00);
  this_01 = maybeRepaintManager(*(QWidgetPrivate **)&parent->field_0x8);
  if (this_01 != (QWidgetRepaintManager *)0x0) {
    if (scrollRect(QRect_const&,int,int)::accelEnv == '\0') {
      iVar6 = __cxa_guard_acquire(&scrollRect(QRect_const&,int,int)::accelEnv);
      if (iVar6 != 0) {
        iVar6 = qEnvironmentVariableIntValue("QT_NO_FAST_SCROLL",(bool *)0x0);
        scrollRect::accelEnv = iVar6 == 0;
        __cxa_guard_release(&scrollRect(QRect_const&,int,int)::accelEnv);
      }
    }
    _region = clipRect(this);
    local_48 = (QRect)QRect::operator&(rect,(QRect *)&region);
    if ((scrollRect::accelEnv == true) && ((this->field_0x252 & 2) != 0)) {
      bVar4 = QWidget::testAttribute_helper(*(QWidget **)&this->field_0x8,WA_WState_InPaintEvent);
      QVar7 = local_70;
      if (!bVar4) {
        uVar1 = (this->data).crect.x1;
        uVar2 = (this->data).crect.y1;
        local_70.y1.m_i = uVar2;
        local_70.x1.m_i = uVar1;
        local_70._8_8_ = QVar7._8_8_;
        _region = QRect::translated(&local_48,(QPoint *)&local_70);
        bVar4 = isOverlapped(this,(QRect *)&region);
        if (bVar4) {
          this_02 = &region;
          region.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
          QRegion::QRegion(this_02,&local_48,Rectangle);
          subtractOpaqueSiblings(this,this_02,(bool *)0x0,false);
          invalidateBackingStore<QRegion>(this,this_02);
        }
        else {
          auVar3._8_8_ = 0;
          auVar3._0_8_ = local_50;
          _region = (QRect)(auVar3 << 0x40);
          local_60 = QWidget::mapTo(this_00,parent,(QPoint *)&region);
          local_70 = QRect::translated(&local_48,dx,dy);
          _region = (QRect)QRect::operator&(&local_70,&local_48);
          QVar7 = QRect::translated((QRect *)&region,-dx,-dy);
          childExpose.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
          local_70 = QVar7;
          QRegion::QRegion(&childExpose,&local_48,Rectangle);
          if ((QVar7.x1.m_i.m_i <= QVar7.x2.m_i.m_i) && (QVar7.y1.m_i.m_i <= QVar7.y2.m_i.m_i)) {
            bVar4 = QWidgetRepaintManager::bltRect
                              ((QWidgetRepaintManager *)this_01,&local_70,dx,dy,this_00);
            if (bVar4) {
              QRegion::QRegion(&dirtyScrollRegion,(QRect *)&region,Rectangle);
              QRegion::operator-=(&childExpose,&dirtyScrollRegion);
              QRegion::~QRegion(&dirtyScrollRegion);
            }
          }
          if ((this->field_0x252 & 8) != 0) {
            _dirtyScrollRegion = QWidget::rect(this_00);
            bVar4 = ::comparesEqual(rect,(QRect *)&dirtyScrollRegion);
            if (bVar4) {
              QRegion::translate((int)this + 0xe0,dx);
            }
            else {
              dirtyScrollRegion.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
              QRegion::intersected((QRect *)&dirtyScrollRegion);
              cVar5 = QRegion::isEmpty();
              if (cVar5 == '\0') {
                QRegion::operator-=(&this->dirty,&dirtyScrollRegion);
                QRegion::translate((int)&dirtyScrollRegion,dx);
                QRegion::operator+=(&this->dirty,&dirtyScrollRegion);
              }
              QRegion::~QRegion(&dirtyScrollRegion);
            }
          }
          if ((this_00->data->widget_attributes & 0x400) == 0) {
            cVar5 = QRegion::isEmpty();
            if (cVar5 == '\0') {
              QWidgetRepaintManager::markDirty<QRegion>
                        ((QWidgetRepaintManager *)this_01,&childExpose,this_00,UpdateLater,
                         BufferValid);
              this->field_0x252 = this->field_0x252 | 0x10;
            }
            QRegion::QRegion(&dirtyScrollRegion,(QRect *)&region,Rectangle);
            QWidgetRepaintManager::markNeedsFlush
                      ((QWidgetRepaintManager *)this_01,this_00,&dirtyScrollRegion,&local_60);
            QRegion::~QRegion(&dirtyScrollRegion);
          }
          this_02 = &childExpose;
        }
        QRegion::~QRegion(this_02);
        goto LAB_0030d804;
      }
    }
    invalidateBackingStore<QRect>(this,&local_48);
  }
LAB_0030d804:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::scrollRect(const QRect &rect, int dx, int dy)
{
    Q_Q(QWidget);
    QWidget *tlw = q->window();

    QWidgetRepaintManager *repaintManager = QWidgetPrivate::get(tlw)->maybeRepaintManager();
    if (!repaintManager)
        return;

    static const bool accelEnv = qEnvironmentVariableIntValue("QT_NO_FAST_SCROLL") == 0;

    const QRect scrollRect = rect & clipRect();
    bool overlapped = false;
    bool accelerateScroll = accelEnv && isOpaque && !q_func()->testAttribute(Qt::WA_WState_InPaintEvent)
                            && !(overlapped = isOverlapped(scrollRect.translated(data.crect.topLeft())));

    if (!accelerateScroll) {
        if (overlapped) {
            QRegion region(scrollRect);
            subtractOpaqueSiblings(region);
            invalidateBackingStore(region);
        }else {
            invalidateBackingStore(scrollRect);
        }
    } else {
        const QPoint toplevelOffset = q->mapTo(tlw, QPoint());
        const QRect destRect = scrollRect.translated(dx, dy) & scrollRect;
        const QRect sourceRect = destRect.translated(-dx, -dy);

        QRegion childExpose(scrollRect);
        if (sourceRect.isValid()) {
            if (repaintManager->bltRect(sourceRect, dx, dy, q))
                childExpose -= destRect;
        }

        if (inDirtyList) {
            if (rect == q->rect()) {
                dirty.translate(dx, dy);
            } else {
                QRegion dirtyScrollRegion = dirty.intersected(scrollRect);
                if (!dirtyScrollRegion.isEmpty()) {
                    dirty -= dirtyScrollRegion;
                    dirtyScrollRegion.translate(dx, dy);
                    dirty += dirtyScrollRegion;
                }
            }
        }

        if (!q->updatesEnabled())
            return;

        if (!childExpose.isEmpty()) {
            repaintManager->markDirty(childExpose, q);
            isScrolled = true;
        }

        // Instead of using native scroll-on-screen, we copy from
        // backingstore, giving only one screen update for each
        // scroll, and a solid appearance
        repaintManager->markNeedsFlush(q, destRect, toplevelOffset);
    }
}